

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O1

void print_skiplist(ion_skiplist_t *skiplist)

{
  ion_key_type_t iVar1;
  ion_sl_node_t *piVar2;
  sl_node *psVar3;
  ulong uVar4;
  
  piVar2 = skiplist->head;
  psVar3 = *piVar2->next;
  while (psVar3 != (sl_node *)0x0) {
    uVar4 = (ulong)(psVar3->height + 1);
    iVar1 = (skiplist->super).key_type;
    if (iVar1 == key_type_null_terminated_string) {
      printf("k: \'%s\' (v: \'%d\') [l: %d] -- ",psVar3->key,(ulong)*psVar3->value,uVar4);
    }
    else if (iVar1 == key_type_numeric_signed) {
      printf("k: \'%d\' (v: \'%d\') [l: %d] -- ",(ulong)*psVar3->key,(ulong)*psVar3->value,uVar4);
    }
    piVar2 = *piVar2->next;
    psVar3 = *piVar2->next;
  }
  puts("END\n");
  return;
}

Assistant:

void
print_skiplist(
	ion_skiplist_t *skiplist
) {
	ion_sl_node_t *cursor = skiplist->head;

	while (NULL != cursor->next[0]) {
		ion_sl_level_t level = cursor->next[0]->height + 1;

		if (key_type_numeric_signed == skiplist->super.key_type) {
			int key		= *((int *) cursor->next[0]->key);
			int value	= *(int *) cursor->next[0]->value;

			printf("k: '%d' (v: '%d') [l: %d] -- ", key, value, level);
		}
		else if (key_type_null_terminated_string == skiplist->super.key_type) {
			char	*key	= cursor->next[0]->key;
			int		value	= *(int *) cursor->next[0]->value;

			printf("k: '%s' (v: '%d') [l: %d] -- ", key, value, level);
		}

		cursor = cursor->next[0];
	}

	printf("%s", "END\n\n");
}